

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O3

REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi,void *value,REF_INT n,REF_TYPE type)

{
  uint uVar1;
  REF_MPI __dest;
  undefined8 uVar2;
  REF_MPI ref_mpi_00;
  char *pcVar3;
  ulong uVar4;
  REF_MPI __size;
  
  if (type == 3) {
    if (n < 0) {
      pcVar3 = "malloc temp of REF_DBL negative";
      uVar2 = 0x355;
LAB_002068c9:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar2,
             "ref_mpi_allsum",pcVar3);
      return 1;
    }
    __size = (REF_MPI)((ulong)(uint)n << 3);
    ref_mpi_00 = __size;
    __dest = (REF_MPI)malloc((size_t)__size);
    if (__dest == (REF_MPI)0x0) {
      pcVar3 = "malloc temp of REF_DBL NULL";
      uVar2 = 0x355;
LAB_002068f8:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar2,
             "ref_mpi_allsum",pcVar3);
      return 2;
    }
  }
  else if (type == 2) {
    if (n < 0) {
      pcVar3 = "malloc temp of REF_LONG negative";
      uVar2 = 0x351;
      goto LAB_002068c9;
    }
    __size = (REF_MPI)((ulong)(uint)n << 3);
    ref_mpi_00 = __size;
    __dest = (REF_MPI)malloc((size_t)__size);
    if (__dest == (REF_MPI)0x0) {
      pcVar3 = "malloc temp of REF_LONG NULL";
      uVar2 = 0x351;
      goto LAB_002068f8;
    }
  }
  else {
    if (type != 1) {
      pcVar3 = "data type";
      uVar1 = 6;
      uVar2 = 0x359;
      uVar4 = 6;
      goto LAB_00206847;
    }
    if (n < 0) {
      pcVar3 = "malloc temp of REF_INT negative";
      uVar2 = 0x34d;
      goto LAB_002068c9;
    }
    __size = (REF_MPI)((ulong)(uint)n << 2);
    ref_mpi_00 = __size;
    __dest = (REF_MPI)malloc((size_t)__size);
    if (__dest == (REF_MPI)0x0) {
      pcVar3 = "malloc temp of REF_INT NULL";
      uVar2 = 0x34d;
      goto LAB_002068f8;
    }
  }
  if (n != 0) {
    ref_mpi_00 = __dest;
    memcpy(__dest,value,(size_t)__size);
  }
  uVar1 = ref_mpi_sum(ref_mpi_00,__dest,value,n,type);
  if (uVar1 == 0) {
    free(__dest);
    return 0;
  }
  pcVar3 = "sum";
  uVar2 = 0x35b;
  uVar4 = (ulong)uVar1;
LAB_00206847:
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",uVar2,
         "ref_mpi_allsum",uVar4,pcVar3);
  return uVar1;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allsum(REF_MPI ref_mpi, void *value, REF_INT n,
                                  REF_TYPE type) {
  REF_INT i;
  void *temp = NULL;
  switch (type) {
    case REF_INT_TYPE:
      ref_malloc(temp, n, REF_INT);
      for (i = 0; i < n; i++) ((REF_INT *)temp)[i] = ((REF_INT *)value)[i];
      break;
    case REF_LONG_TYPE:
      ref_malloc(temp, n, REF_LONG);
      for (i = 0; i < n; i++) ((REF_LONG *)temp)[i] = ((REF_LONG *)value)[i];
      break;
    case REF_DBL_TYPE:
      ref_malloc(temp, n, REF_DBL);
      for (i = 0; i < n; i++) ((REF_DBL *)temp)[i] = ((REF_DBL *)value)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  RSS(ref_mpi_sum(ref_mpi, temp, value, n, type), "sum");
  ref_free(temp);
  RSS(ref_mpi_bcast(ref_mpi, value, n, type), "bcast")
  return REF_SUCCESS;
}